

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Point3f __thiscall pbrt::detail::Hammersley3DIter::operator*(Hammersley3DIter *this)

{
  int iVar1;
  Float FVar2;
  Float FVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  Point3f PVar5;
  
  iVar1 = (this->super_IndexingIterator<pbrt::detail::Hammersley3DIter>).i;
  auVar4._4_12_ = in_ZMM0._4_12_;
  auVar4._0_4_ = (float)iVar1 /
                 (float)(this->super_IndexingIterator<pbrt::detail::Hammersley3DIter>).n;
  FVar2 = RadicalInverse(0,(long)iVar1);
  FVar3 = RadicalInverse(1,(long)(this->super_IndexingIterator<pbrt::detail::Hammersley3DIter>).i);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)FVar2),0x10);
  PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar4._0_8_;
  PVar5.super_Tuple3<pbrt::Point3,_float>.z = FVar3;
  return (Point3f)PVar5.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Point3f operator*() {
        return {Float(i) / Float(n), RadicalInverse(0, i), RadicalInverse(1, i)};
    }